

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O2

Key * __thiscall
QProcessEnvironmentPrivate::prepareName
          (Key *__return_storage_ptr__,QProcessEnvironmentPrivate *this,QString *name)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  QArrayDataPointer<char> *other;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._0_8_ = &this->nameMapMutex;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
  local_30[8] = true;
  other = &QHash<QString,_QByteArray>::operator[](&this->nameMap,name)->d;
  if (other->size == 0) {
    QString::toLocal8Bit((QByteArray *)&local_48,name);
    pDVar2 = other->d;
    pcVar3 = other->ptr;
    other->d = local_48.d;
    other->ptr = local_48.ptr;
    qVar1 = other->size;
    other->size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline Key prepareName(const QString &name) const
    {
        const NameMapMutexLocker locker(this);
        Key &ent = nameMap[name];
        if (ent.isEmpty())
            ent = name.toLocal8Bit();
        return ent;
    }